

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Matrix * __thiscall rw::Matrix::rotate(Matrix *this,Quat *q,CombineOp op)

{
  undefined1 local_9c [8];
  Matrix rot;
  Matrix tmp;
  CombineOp op_local;
  Quat *q_local;
  Matrix *this_local;
  
  makeRotation((Matrix *)local_9c,q);
  if (op == COMBINEREPLACE) {
    memcpy(this,local_9c,0x40);
  }
  else if (op == COMBINEPRECONCAT) {
    mult((Matrix *)&rot.pos.z,(Matrix *)local_9c,this);
    memcpy(this,&rot.pos.z,0x40);
  }
  else if (op == COMBINEPOSTCONCAT) {
    mult((Matrix *)&rot.pos.z,this,(Matrix *)local_9c);
    memcpy(this,&rot.pos.z,0x40);
  }
  return this;
}

Assistant:

Matrix*
Matrix::rotate(const Quat &q, CombineOp op)
{
	Matrix tmp, rot;
	makeRotation(&rot, q);
	switch(op){
	case COMBINEREPLACE:
		*this = rot;
		break;
	case COMBINEPRECONCAT:
		mult(&tmp, &rot, this);
		*this = tmp;
		break;
	case COMBINEPOSTCONCAT:
		mult(&tmp, this, &rot);
		*this = tmp;
		break;
	}
	return this;
}